

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::Shutdown(CGraphics_Threaded *this)

{
  CCommandBuffer *this_00;
  int i;
  long lVar1;
  
  (*this->m_pBackend->_vptr_IGraphicsBackend[3])();
  if (this->m_pBackend != (IGraphicsBackend *)0x0) {
    (*this->m_pBackend->_vptr_IGraphicsBackend[1])();
  }
  this->m_pBackend = (IGraphicsBackend *)0x0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    this_00 = this->m_apCommandBuffers[lVar1];
    if (this_00 != (CCommandBuffer *)0x0) {
      CCommandBuffer::~CCommandBuffer(this_00);
    }
    operator_delete(this_00,0x30);
  }
  return;
}

Assistant:

void CGraphics_Threaded::Shutdown()
{
	// shutdown the backend
	m_pBackend->Shutdown();
	delete m_pBackend;
	m_pBackend = 0x0;

	// delete the command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		delete m_apCommandBuffers[i];
}